

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O1

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,CheckerInstanceBodySymbol *symbol)

{
  Symbol *this_00;
  
  if (((this->visitInstances == true) && (*this->numErrors <= (ulong)this->errorLimit)) &&
     ((this->hierarchyProblem & 1U) == 0)) {
    if (symbol->instanceDepth <= (this->compilation->options).maxCheckerInstanceDepth) {
      if ((symbol->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&symbol->super_Scope);
      }
      for (this_00 = (symbol->super_Scope).firstMember; this_00 != (Symbol *)0x0;
          this_00 = this_00->nextInScope) {
        Symbol::visit<slang::ast::DiagnosticVisitor&>(this_00,this);
      }
      return;
    }
    this->hierarchyProblem = true;
  }
  return;
}

Assistant:

void handle(const CheckerInstanceBodySymbol& symbol) {
        if (!visitInstances || finishedEarly())
            return;

        if (symbol.instanceDepth > compilation.getOptions().maxCheckerInstanceDepth) {
            hierarchyProblem = true;
            return;
        }

        visitDefault(symbol);
    }